

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceMemoryBase.cpp
# Opt level: O3

void Diligent::ValidateDeviceMemoryDesc(DeviceMemoryDesc *Desc,IRenderDevice *pDevice)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  char *local_20;
  
  if (Desc->Type == DEVICE_MEMORY_TYPE_SPARSE) {
    iVar2 = (*(pDevice->super_IObject)._vptr_IObject[0x19])();
    uVar3 = Desc->PageSize;
    if (uVar3 == 0) {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      local_20 = "";
      if (pcVar1 != (char *)0x0) {
        local_20 = pcVar1;
      }
      LogError<true,char[31],char_const*,char[15],char[27]>
                (false,"ValidateDeviceMemoryDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceMemoryBase.cpp"
                 ,0x31,(char (*) [31])"Description of device memory \'",&local_20,
                 (char (*) [15])"\' is invalid: ",(char (*) [27])"page size must not be zero");
      uVar3 = Desc->PageSize;
    }
    if (uVar3 % (ulong)*(uint *)(CONCAT44(extraout_var,iVar2) + 0x1b4) != 0) {
      pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
      local_20 = "";
      if (pcVar1 != (char *)0x0) {
        local_20 = pcVar1;
      }
      LogError<true,char[31],char_const*,char[15],char[12],unsigned_long,char[43],unsigned_int,char[2]>
                (false,"ValidateDeviceMemoryDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceMemoryBase.cpp"
                 ,0x36,(char (*) [31])"Description of device memory \'",&local_20,
                 (char (*) [15])"\' is invalid: ",(char (*) [12])0x81b9e9,&Desc->PageSize,
                 (char (*) [43])") is not a multiple of sparse block size (",
                 (uint *)(CONCAT44(extraout_var,iVar2) + 0x1b4),(char (*) [2])0x920060);
    }
  }
  else {
    pcVar1 = (Desc->super_DeviceObjectAttribs).Name;
    local_20 = "";
    if (pcVar1 != (char *)0x0) {
      local_20 = pcVar1;
    }
    LogError<true,char[31],char_const*,char[15],char[30]>
              (false,"ValidateDeviceMemoryDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceMemoryBase.cpp"
               ,0x3a,(char (*) [31])"Description of device memory \'",&local_20,
               (char (*) [15])"\' is invalid: ",(char (*) [30])"Unexpected device memory type");
  }
  return;
}

Assistant:

void ValidateDeviceMemoryDesc(const DeviceMemoryDesc& Desc, const IRenderDevice* pDevice) noexcept(false)
{
    if (Desc.Type == DEVICE_MEMORY_TYPE_SPARSE)
    {
        const auto& SparseRes = pDevice->GetAdapterInfo().SparseResources;

        VERIFY_DEVMEMORY(Desc.PageSize != 0, "page size must not be zero");

        // In a very rare case when the resource has a custom memory alignment that is not a multiple of StandardBlockSize,
        // this might be a false positive.
        VERIFY_DEVMEMORY((Desc.PageSize % SparseRes.StandardBlockSize) == 0,
                         "page size (", Desc.PageSize, ") is not a multiple of sparse block size (", SparseRes.StandardBlockSize, ")");
    }
    else
    {
        LOG_DEVMEMORY_ERROR_AND_THROW("Unexpected device memory type");
    }
}